

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::CommissionerImpl::DecodeCommissionerDataset
                  (Error *__return_storage_ptr__,CommissionerDataset *aDataset,Response *aResponse)

{
  ErrorCode EVar1;
  Tlv *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ulong uVar4;
  undefined8 uVar5;
  uint16_t uVar6;
  mapped_type *pmVar7;
  ByteArray *pBVar8;
  CommissionerDataset dataset;
  TlvSet tlvSet;
  int local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  char local_70 [16];
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_60;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0 = 0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_90 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  tlv::GetTlvSet((Error *)local_88,(TlvSet *)&local_60,&aResponse->mPayload,kMeshCoP);
  __return_storage_ptr__->mCode = local_88._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_80);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_80._M_p != local_70) {
    operator_delete(local_80._M_p);
  }
  if (EVar1 == kNone) {
    local_88[0] = 0xb;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_60,local_88);
    pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      uVar6 = tlv::Tlv::GetValueAsUint16(pTVar2);
      local_e0 = (uint)uVar6 << 0x10;
      uStack_90 = uStack_90 | 0x4000000000000000;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_88[0] = 9;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_60,local_88);
    pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      uVar6 = tlv::Tlv::GetValueAsUint16(pTVar2);
      local_e0 = CONCAT22(local_e0._2_2_,uVar6);
      uStack_90 = uStack_90 | 0x8000000000000000;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_88[0] = 8;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_60,local_88);
    pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      pBVar8 = tlv::Tlv::GetValue(pTVar2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_d8,pBVar8);
      uStack_90 = uStack_90 | 0x2000000000000000;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_88[0] = 0x3d;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_60,local_88);
    pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      pBVar8 = tlv::Tlv::GetValue(pTVar2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&vStack_c0,pBVar8);
      uStack_90 = uStack_90 | 0x1000000000000000;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_88[0] = 0x3e;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_60,local_88);
    pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      pBVar8 = tlv::Tlv::GetValue(pTVar2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_a8,pBVar8);
      uStack_90 = uStack_90 | 0x800000000000000;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_88[0] = 0x12;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_60,local_88);
    pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      uVar6 = tlv::Tlv::GetValueAsUint16(pTVar2);
      uVar4 = uStack_90;
      uStack_90 = CONCAT62(uStack_90._2_6_,uVar6);
      uVar5 = uStack_90;
      uStack_90._7_1_ = SUB81(uVar4,7);
      uStack_90._0_7_ = (undefined7)uVar5;
      uStack_90 = CONCAT17(uStack_90._7_1_,(undefined7)uStack_90) | 0x400000000000000;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_88[0] = 0x41;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_60,local_88);
    pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      uVar6 = tlv::Tlv::GetValueAsUint16(pTVar2);
      uVar4 = uStack_90;
      uStack_90._0_4_ = CONCAT22(uVar6,(undefined2)uStack_90);
      uVar5 = uStack_90;
      uStack_90._7_1_ = SUB81(uVar4,7);
      uStack_90._0_7_ = (undefined7)uVar5;
      uStack_90 = CONCAT17(uStack_90._7_1_,(undefined7)uStack_90) | 0x200000000000000;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    local_88[0] = 0x42;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_60,local_88);
    pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      uVar6 = tlv::Tlv::GetValueAsUint16(pTVar2);
      uVar4 = uStack_90;
      uStack_90._0_6_ = CONCAT24(uVar6,(undefined4)uStack_90);
      uVar5 = uStack_90;
      uStack_90._7_1_ = SUB81(uVar4,7);
      uStack_90._0_7_ = (undefined7)uVar5;
      uStack_90 = CONCAT17(uStack_90._7_1_,(undefined7)uStack_90) | 0x100000000000000;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    aDataset->mBorderAgentLocator = (undefined2)local_e0;
    aDataset->mSessionId = local_e0._2_2_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDataset->mSteeringData,&local_d8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDataset->mAeSteeringData,&vStack_c0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDataset->mNmkpSteeringData,&local_a8);
    aDataset->mJoinerUdpPort = (undefined2)uStack_90;
    aDataset->mAeUdpPort = uStack_90._2_2_;
    aDataset->mNmkpUdpPort = uStack_90._4_2_;
    aDataset->mPresentFlags = uStack_90._6_2_;
  }
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (vStack_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodeCommissionerDataset(CommissionerDataset &aDataset, const coap::Response &aResponse)
{
    Error               error;
    tlv::TlvSet         tlvSet;
    CommissionerDataset dataset;

    SuccessOrExit(error = GetTlvSet(tlvSet, aResponse));

    if (auto sessionId = tlvSet[tlv::Type::kCommissionerSessionId])
    {
        dataset.mSessionId = sessionId->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kSessionIdBit;
    }

    if (auto borderAgentLocator = tlvSet[tlv::Type::kBorderAgentLocator])
    {
        dataset.mBorderAgentLocator = borderAgentLocator->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kBorderAgentLocatorBit;
    }

    if (auto steeringData = tlvSet[tlv::Type::kSteeringData])
    {
        dataset.mSteeringData = steeringData->GetValue();
        dataset.mPresentFlags |= CommissionerDataset::kSteeringDataBit;
    }

    if (auto aeSteeringData = tlvSet[tlv::Type::kAeSteeringData])
    {
        dataset.mAeSteeringData = aeSteeringData->GetValue();
        dataset.mPresentFlags |= CommissionerDataset::kAeSteeringDataBit;
    }

    if (auto nmkpSteeringData = tlvSet[tlv::Type::kNmkpSteeringData])
    {
        dataset.mNmkpSteeringData = nmkpSteeringData->GetValue();
        dataset.mPresentFlags |= CommissionerDataset::kNmkpSteeringDataBit;
    }

    if (auto joinerUdpPort = tlvSet[tlv::Type::kJoinerUdpPort])
    {
        dataset.mJoinerUdpPort = joinerUdpPort->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kJoinerUdpPortBit;
    }

    if (auto aeUdpPort = tlvSet[tlv::Type::kAeUdpPort])
    {
        dataset.mAeUdpPort = aeUdpPort->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kAeUdpPortBit;
    }

    if (auto nmkpUdpPort = tlvSet[tlv::Type::kNmkpUdpPort])
    {
        dataset.mNmkpUdpPort = nmkpUdpPort->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kNmkpUdpPortBit;
    }

    aDataset = dataset;

exit:
    return error;
}